

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void FFTProcess<double>(UnityComplexNumber *data,int numsamples,bool forward)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  uint uVar8;
  ulong uVar9;
  float *pfVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  double __x;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  uVar5 = 0;
  if (1 < (uint)numsamples) {
    uVar8 = 1;
    do {
      uVar8 = uVar8 * 2;
      uVar13 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar13;
    } while (uVar8 < (uint)numsamples);
    uVar5 = (ulong)uVar13;
  }
  puVar4 = FFTProcess<double>::reversetable[uVar5];
  if (puVar4 == (uint *)0x0) {
    uVar6 = 0xffffffffffffffff;
    if (-1 < numsamples) {
      uVar6 = (long)numsamples << 2;
    }
    puVar4 = (uint *)operator_new__(uVar6);
    if (numsamples != 0) {
      uVar6 = 0;
      do {
        uVar8 = 0;
        if (numsamples != 1) {
          uVar13 = 1;
          uVar8 = 0;
          uVar11 = numsamples >> 1;
          do {
            uVar12 = uVar11 & (uint)uVar6;
            if (uVar12 != 0) {
              uVar12 = uVar13;
            }
            uVar8 = uVar8 | uVar12;
            uVar13 = uVar13 * 2;
            bVar3 = 1 < uVar11;
            uVar11 = uVar11 >> 1;
          } while (bVar3);
        }
        puVar4[uVar6] = uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)numsamples);
    }
    FFTProcess<double>::reversetable[uVar5] = puVar4;
  }
  if (numsamples != 0) {
    uVar5 = 0;
    do {
      uVar6 = (ulong)puVar4[uVar5];
      if (uVar5 < uVar6) {
        fVar1 = data[uVar5].re;
        data[uVar5].re = data[uVar6].re;
        data[uVar6].re = fVar1;
        fVar1 = data[uVar5].im;
        data[uVar5].im = data[uVar6].im;
        data[uVar6].im = fVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)numsamples != uVar5);
  }
  if (1 < numsamples) {
    if (forward) {
      __x = -3.141592653589793;
    }
    else {
      __x = 3.141592653589793;
    }
    uVar8 = 1;
    do {
      dVar14 = cos(__x);
      dVar15 = sin(__x);
      uVar13 = uVar8 * 2;
      if (0 < (int)uVar8) {
        uVar5 = (ulong)uVar8;
        uVar6 = 0;
        dVar16 = 1.0;
        pfVar7 = &data->im;
        dVar17 = 0.0;
        do {
          if ((int)uVar6 < numsamples) {
            uVar9 = uVar6 & 0xffffffff;
            pfVar10 = pfVar7;
            do {
              dVar18 = (double)pfVar10[uVar5 * 2 + -1] * dVar16 +
                       (double)pfVar10[uVar5 * 2] * -dVar17;
              fVar1 = ((UnityComplexNumber *)(pfVar10 + -1))->re;
              dVar19 = dVar16 * (double)pfVar10[uVar5 * 2] +
                       dVar17 * (double)pfVar10[uVar5 * 2 + -1];
              pfVar10[uVar5 * 2 + -1] = (float)((double)fVar1 - dVar18);
              fVar2 = *pfVar10;
              pfVar10[uVar5 * 2] = (float)((double)fVar2 - dVar19);
              ((UnityComplexNumber *)(pfVar10 + -1))->re = (float)(dVar18 + (double)fVar1);
              *pfVar10 = (float)(dVar19 + (double)fVar2);
              pfVar10 = pfVar10 + (ulong)uVar13 * 2;
              uVar8 = (int)uVar9 + uVar13;
              uVar9 = (ulong)uVar8;
            } while ((int)uVar8 < numsamples);
          }
          dVar18 = dVar16 * dVar15;
          dVar16 = dVar16 * dVar14 - dVar17 * dVar15;
          uVar6 = uVar6 + 1;
          pfVar7 = pfVar7 + 2;
          dVar17 = dVar18 + dVar14 * dVar17;
        } while (uVar6 != uVar5);
      }
      __x = __x * 0.5;
      uVar8 = uVar13;
    } while ((int)uVar13 < numsamples);
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}